

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O0

void callback_conv_args(CTState *cts,lua_State *L)

{
  ushort uVar1;
  TValue *pTVar2;
  intptr_t *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  CType *pCVar7;
  TValue TVar8;
  cTValue *local_140;
  MSize n;
  int isfp;
  CTSize sz;
  void *sp;
  CType *cta;
  CType *ctf;
  MSize nfpr;
  MSize maxgpr;
  MSize nsp;
  MSize ngpr;
  int fntp;
  GCfunc *fn;
  CType *ct;
  uint local_e0;
  int gcsteps;
  CTypeID fid;
  CTypeID rid;
  CTypeID id;
  MSize slot;
  intptr_t *stack;
  TValue *o;
  lua_State *L_local;
  CTState *cts_local;
  CType *local_68;
  
  pTVar2 = L->top;
  piVar3 = (cts->cb).stack;
  uVar5 = (cts->cb).slot;
  ct._4_4_ = 0;
  maxgpr = 0;
  nfpr = 0;
  ctf._4_4_ = 0;
  if ((uVar5 < (cts->cb).sizeid) && (uVar4 = (uint)(cts->cb).cbid[uVar5], uVar4 != 0)) {
    fn = (GCfunc *)(cts->tab + uVar4);
    gcsteps = *(uint *)fn & 0xffff;
    if (uVar5 < cts->miscmap->asize) {
      local_140 = (cTValue *)((cts->miscmap->array).ptr64 + (long)(int)uVar5 * 8);
    }
    else {
      local_140 = lj_tab_getinth(cts->miscmap,uVar5);
    }
    _ngpr = (lua_State *)(local_140->u64 & 0x7fffffffffff);
    nsp = 0xfffffff7;
  }
  else {
    fn = (GCfunc *)0x0;
    gcsteps = 0;
    nsp = 0xfffffff9;
    _ngpr = L;
  }
  pTVar2->u64 = 1;
  TVar8.field_4.it = 0;
  TVar8.field_4.i = gcsteps;
  pTVar2[1] = TVar8;
  pTVar2[2].u64 = (ulong)_ngpr | (ulong)nsp << 0x2f;
  pTVar2[3].u64 = (long)(pTVar2 + 3) + (10 - (long)L->base);
  L->base = pTVar2 + 4;
  L->top = pTVar2 + 4;
  if (fn == (GCfunc *)0x0) {
    lj_err_caller(cts->L,LJ_ERR_FFI_BADCBACK);
  }
  if (_ngpr->dummy_ffid == '\0') {
    *(undefined1 **)((long)L->cframe + 0x18) = (undefined1 *)((long)&(_ngpr->base->gcr).gcptr64 + 4)
    ;
  }
  if ((long)((L->maxstack).ptr64 - (long)L->top) < 0xa1) {
    lj_state_growstack(L,0x14);
  }
  stack = (intptr_t *)L->base;
  uVar1._0_1_ = *(uint8_t *)((long)fn + 8);
  uVar1._1_1_ = *(uint8_t *)((long)fn + 9);
  do {
    local_e0 = (uint)uVar1;
    if (local_e0 == 0) {
      L->top = (TValue *)stack;
      while (iVar6 = ct._4_4_ + -1, 0 < ct._4_4_) {
        ct._4_4_ = iVar6;
        if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
          lj_gc_step(L);
        }
      }
      return;
    }
    pCVar7 = cts->tab + local_e0;
    local_68 = pCVar7;
    if (pCVar7->info >> 0x1c != 8) {
      do {
        local_68 = cts->tab + (local_68->info & 0xffff);
      } while (local_68->info >> 0x1c == 8);
      uVar5 = local_68->size + 7 >> 3;
      if ((local_68->info & 0xf4000000) == 0x4000000) {
        if (ctf._4_4_ + uVar5 < 9) {
          _isfp = (cts->cb).fpr + ctf._4_4_;
          ctf._4_4_ = uVar5 + ctf._4_4_;
        }
        else {
LAB_0012fc0a:
          _isfp = (FPRCBArg *)(piVar3 + nfpr);
          nfpr = uVar5 + nfpr;
        }
      }
      else {
        if (6 < maxgpr + uVar5) goto LAB_0012fc0a;
        _isfp = (FPRCBArg *)((cts->cb).gpr + maxgpr);
        maxgpr = uVar5 + maxgpr;
      }
      iVar6 = lj_cconv_tv_ct(cts,local_68,0,(TValue *)stack,(uint8_t *)_isfp);
      ct._4_4_ = iVar6 + ct._4_4_;
      stack = stack + 1;
    }
    uVar1 = pCVar7->sib;
  } while( true );
}

Assistant:

static void callback_conv_args(CTState *cts, lua_State *L)
{
  TValue *o = L->top;
  intptr_t *stack = cts->cb.stack;
  MSize slot = cts->cb.slot;
  CTypeID id = 0, rid, fid;
  int gcsteps = 0;
  CType *ct;
  GCfunc *fn;
  int fntp;
  MSize ngpr = 0, nsp = 0, maxgpr = CCALL_NARG_GPR;
#if CCALL_NARG_FPR
  MSize nfpr = 0;
#if LJ_TARGET_ARM
  MSize fprodd = 0;
#endif
#endif

  if (slot < cts->cb.sizeid && (id = cts->cb.cbid[slot]) != 0) {
    ct = ctype_get(cts, id);
    rid = ctype_cid(ct->info);  /* Return type. x86: +(spadj<<16). */
    fn = funcV(lj_tab_getint(cts->miscmap, (int32_t)slot));
    fntp = LJ_TFUNC;
  } else {  /* Must set up frame first, before throwing the error. */
    ct = NULL;
    rid = 0;
    fn = (GCfunc *)L;
    fntp = LJ_TTHREAD;
  }
  /* Continuation returns from callback. */
  if (LJ_FR2) {
    (o++)->u64 = LJ_CONT_FFI_CALLBACK;
    (o++)->u64 = rid;
  } else {
    o->u32.lo = LJ_CONT_FFI_CALLBACK;
    o->u32.hi = rid;
    o++;
  }
  setframe_gc(o, obj2gco(fn), fntp);
  if (LJ_FR2) o++;
  setframe_ftsz(o, ((char *)(o+1) - (char *)L->base) + FRAME_CONT);
  L->top = L->base = ++o;
  if (!ct)
    lj_err_caller(cts->L, LJ_ERR_FFI_BADCBACK);
  if (isluafunc(fn))
    setcframe_pc(L->cframe, proto_bc(funcproto(fn))+1);
  lj_state_checkstack(L, LUA_MINSTACK);  /* May throw. */
  o = L->base;  /* Might have been reallocated. */

#if LJ_TARGET_X86
  /* x86 has several different calling conventions. */
  switch (ctype_cconv(ct->info)) {
  case CTCC_FASTCALL: maxgpr = 2; break;
  case CTCC_THISCALL: maxgpr = 1; break;
  default: maxgpr = 0; break;
  }
#endif

  fid = ct->sib;
  while (fid) {
    CType *ctf = ctype_get(cts, fid);
    if (!ctype_isattrib(ctf->info)) {
      CType *cta;
      void *sp;
      CTSize sz;
      int isfp;
      MSize n;
      lj_assertCTS(ctype_isfield(ctf->info), "field expected");
      cta = ctype_rawchild(cts, ctf);
      isfp = ctype_isfp(cta->info);
      sz = (cta->size + CTSIZE_PTR-1) & ~(CTSIZE_PTR-1);
      n = sz / CTSIZE_PTR;  /* Number of GPRs or stack slots needed. */

      CALLBACK_HANDLE_REGARG  /* Handle register arguments. */

      /* Otherwise pass argument on stack. */
      if (CCALL_ALIGN_STACKARG && LJ_32 && sz == 8)
	nsp = (nsp + 1) & ~1u;  /* Align 64 bit argument on stack. */
      sp = &stack[nsp];
      nsp += n;

    done:
      if (LJ_BE && cta->size < CTSIZE_PTR
#if LJ_TARGET_MIPS64
	  && !(isfp && nsp)
#endif
	 )
	sp = (void *)((uint8_t *)sp + CTSIZE_PTR-cta->size);
      gcsteps += lj_cconv_tv_ct(cts, cta, 0, o++, sp);
    }
    fid = ctf->sib;
  }
  L->top = o;
#if LJ_TARGET_X86
  /* Store stack adjustment for returns from non-cdecl callbacks. */
  if (ctype_cconv(ct->info) != CTCC_CDECL) {
#if LJ_FR2
    (L->base-3)->u64 |= (nsp << (16+2));
#else
    (L->base-2)->u32.hi |= (nsp << (16+2));
#endif
  }
#endif
  while (gcsteps-- > 0)
    lj_gc_check(L);
}